

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O3

add_torrent_params * __thiscall
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,span<const_char> buffer)

{
  span<const_char> buffer_00;
  error_code ec;
  bdecode_node rd;
  bdecode_node local_60;
  
  buffer_00.m_ptr = buffer.m_ptr;
  buffer_00.m_len = (difference_type)&stack0xffffffffffffff90;
  bdecode(&local_60,this,buffer_00,(error_code *)0x0,(int *)0x64,2000000,0);
  read_resume_data(__return_storage_ptr__,&local_60,(error_code *)&stack0xffffffffffffff90);
  if (local_60.m_tokens.
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.m_tokens.
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(span<char const> buffer)
	{
		error_code ec;
		bdecode_node rd = bdecode(buffer, ec);
		if (ec) throw system_error(ec);

		auto ret = read_resume_data(rd, ec);
		if (ec) throw system_error(ec);
		return ret;
	}